

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void simd::Threshold(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                    uint32_t startYOut,uint32_t width,uint32_t height,uint8_t threshold,
                    SIMDType simdType)

{
  uint32_t rowSizeIn;
  uint32_t rowSizeOut;
  SIMDType SVar1;
  SIMDType SVar2;
  uint uVar3;
  uint8_t *outY;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  uint simdWidth;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  SVar1 = simdType;
  do {
    SVar2 = SVar1;
    if (SVar2 != avx_function) {
      if (SVar2 - sse_function < 2) {
        uVar3 = 0x10;
        if (0xf < width) goto LAB_0012601f;
      }
      else {
        uVar3 = 0;
        if (SVar2 != cpu_function) goto LAB_0012601f;
      }
      Image_Function::Threshold(in,startXIn,startYIn,out,startXOut,startYOut,width,height,threshold)
      ;
      return;
    }
    SVar1 = sse_function;
  } while (width < 0x20);
  uVar3 = 0x20;
LAB_0012601f:
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  local_80._data = (uchar *)0x0;
  local_80._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src_00);
  Image_Function::
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&width,&height,in,&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  rowSizeIn = in->_rowSize;
  rowSizeOut = out->_rowSize;
  simdWidth = width / uVar3;
  outY = out->_data + (ulong)startXOut + (ulong)(startYOut * rowSizeOut);
  if (SVar2 == sse_function) {
    sse::Threshold(rowSizeIn,rowSizeOut,in->_data + (ulong)startXIn + (ulong)(startYIn * rowSizeIn),
                   outY,outY + height * rowSizeOut,threshold,simdWidth,simdWidth * uVar3,
                   width % uVar3);
  }
  else if (SVar2 == avx_function) {
    avx::Threshold(rowSizeIn,rowSizeOut,in->_data + (ulong)startXIn + (ulong)(startYIn * rowSizeIn),
                   outY,outY + height * rowSizeOut,threshold,simdWidth,simdWidth * uVar3,
                   width % uVar3);
  }
  return;
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height, uint8_t threshold, SIMDType simdType )
    {
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width < simdSize) ) {
            AVX_CODE( Threshold( in, startXIn, startYIn, out, startXOut, startYOut, width, height, threshold, sse_function ); )

            Image_Function::Threshold( in, startXIn, startYIn, out, startXOut, startYOut, width, height, threshold );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyGrayScaleImage( in, out );

        Image_Function::OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, threshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, threshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, threshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }